

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O0

wchar_t curses_display_objects
                  (nh_objitem *items,wchar_t icount,char *title,wchar_t how,nh_objresult *results)

{
  int iVar1;
  bool bVar2;
  nh_bool nVar3;
  undefined4 uVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  gamewin *gw_00;
  win_objmenu *mdat_00;
  WINDOW_conflict *pWVar7;
  char *pcVar8;
  wchar_t local_188;
  wchar_t local_184;
  int local_17c;
  int local_170;
  wchar_t grouphits;
  wchar_t end;
  char sbuf [256];
  nh_bool cancelled;
  nh_bool done;
  wchar_t prev_offset;
  wchar_t prevcurs;
  wchar_t starty;
  wchar_t startx;
  wchar_t rv;
  wchar_t idx;
  wchar_t key;
  wchar_t i;
  win_objmenu *mdat;
  gamewin *gw;
  nh_objresult *results_local;
  wchar_t how_local;
  char *title_local;
  wchar_t icount_local;
  nh_objitem *items_local;
  
  uVar4 = curs_set(0);
  gw_00 = alloc_gamewin(L'H');
  gw_00->draw = draw_objmenu;
  gw_00->resize = resize_objmenu;
  mdat_00 = (win_objmenu *)(gw_00 + 1);
  gw_00[1].resize = (_func_void_gamewin_ptr *)items;
  *(wchar_t *)&gw_00[1].prev = icount;
  gw_00[1].next = (gamewin *)title;
  *(wchar_t *)((long)&gw_00[1].prev + 4) = how;
  *(undefined4 *)((long)&gw_00[2].draw + 4) = 0xffffffff;
  pWVar7 = (WINDOW_conflict *)calloc((long)icount,4);
  gw_00[1].win = pWVar7;
  if ((how != L'\0') && (how != L'\xffffffff')) {
    assign_objmenu_accelerators(mdat_00);
  }
  layout_objmenu(gw_00);
  pWVar7 = (WINDOW_conflict *)
           newwin(*(undefined4 *)&gw_00[2].resize,*(undefined4 *)((long)&gw_00[2].win + 4),
                  (_LINES - *(int *)&gw_00[2].resize) / 2,
                  (_COLS - *(int *)((long)&gw_00[2].win + 4)) / 2);
  gw_00->win = pWVar7;
  keypad(gw_00->win,1);
  nh_box_wborder((WINDOW *)gw_00->win,0x600);
  pWVar7 = (WINDOW_conflict *)
           derwin(gw_00->win,*(undefined4 *)&gw_00[2].win,*(undefined4 *)&gw_00[2].next,
                  *(int *)((long)&gw_00[2].resize + 4) + -1,2);
  mdat_00->content = pWVar7;
  leaveok(gw_00->win,1);
  leaveok(mdat_00->content,1);
  sbuf[0xff] = '\0';
  sbuf[0xfe] = '\0';
LAB_00110f4a:
  do {
    while( true ) {
      if (sbuf[0xff] != '\0' || sbuf[0xfe] != '\0') {
        delwin(mdat_00->content);
        delwin(gw_00->win);
        if (sbuf[0xfe] == '\0') {
          starty = L'\0';
          for (idx = L'\0'; idx < icount; idx = idx + L'\x01') {
            if (((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17] != L'\0') {
              if (results != (nh_objresult *)0x0) {
                results[starty].id = items[idx].id;
                results[starty].count = ((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17];
              }
              starty = starty + L'\x01';
            }
          }
        }
        else {
          starty = L'\xffffffff';
        }
        free(gw_00[1].win);
        delete_gamewin(gw_00);
        redraw_game_windows();
        curs_set(uVar4);
        return starty;
      }
      draw_objmenu(gw_00);
      wVar5 = nh_wgetch(gw_00->win);
      if (wVar5 != L'\r') break;
LAB_0011125a:
      sbuf[0xff] = '\x01';
    }
    if (wVar5 == L'\x1b') {
      sbuf[0xfe] = '\x01';
      goto LAB_00110f4a;
    }
    if (wVar5 == L' ') {
LAB_00111198:
      iVar1 = *(int *)&gw_00[2].draw;
      *(int *)&gw_00[2].draw = *(int *)&gw_00[2].win + *(int *)&gw_00[2].draw;
      if (*(int *)&gw_00[1].prev - *(int *)&gw_00[2].win < *(int *)&gw_00[2].draw) {
        *(int *)&gw_00[2].draw = *(int *)&gw_00[1].prev - *(int *)&gw_00[2].win;
      }
      if ((wVar5 == L' ') && (iVar1 == *(int *)&gw_00[2].draw)) {
        sbuf[0xff] = '\x01';
      }
      goto LAB_00110f4a;
    }
    if (wVar5 != L',') {
      if (wVar5 == L'-') {
        for (idx = L'\0'; idx < icount; idx = idx + L'\x01') {
          ((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17] = L'\0';
        }
      }
      else if (wVar5 == L'.') {
        if (*(int *)((long)&gw_00[1].prev + 4) == 2) {
          for (idx = L'\0'; idx < icount; idx = idx + L'\x01') {
            if (*(int *)(gw_00[1].resize + (long)idx * 0x124 + 0x110) != -1) {
              ((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17] = L'\xffffffff';
            }
          }
        }
      }
      else if (wVar5 == L':') {
        curses_getline("Search:",(char *)&grouphits);
        idx = L'\0';
        while ((idx < icount &&
               (pcVar8 = strstr((char *)(gw_00[1].resize + (long)idx * 0x124),(char *)&grouphits),
               pcVar8 == (char *)0x0))) {
          idx = idx + L'\x01';
        }
        if (idx < icount) {
          if (*(int *)&gw_00[1].prev - *(int *)&gw_00[2].win < 1) {
            local_184 = L'\0';
          }
          else {
            local_184 = *(int *)&gw_00[1].prev - *(int *)&gw_00[2].win;
          }
          if (idx < local_184) {
            local_188 = idx;
          }
          else {
            local_188 = local_184;
          }
          *(wchar_t *)&gw_00[2].draw = local_188;
        }
      }
      else {
        if (wVar5 == L'<') {
LAB_0011116b:
          *(int *)&gw_00[2].draw = *(int *)&gw_00[2].draw - *(int *)&gw_00[2].win;
          if (*(int *)&gw_00[2].draw < 0) {
            *(undefined4 *)&gw_00[2].draw = 0;
          }
          goto LAB_00110f4a;
        }
        if (wVar5 == L'>') goto LAB_00111198;
        if (wVar5 == L'@') {
          if (*(int *)((long)&gw_00[1].prev + 4) == 2) {
            for (idx = L'\0'; idx < icount; idx = idx + L'\x01') {
              if (*(int *)(gw_00[1].resize + (long)idx * 0x124 + 0x110) != -1) {
                wVar5 = L'\xffffffff';
                if (((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17] != L'\0') {
                  wVar5 = L'\0';
                }
                ((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17] = wVar5;
              }
            }
          }
        }
        else {
          if (wVar5 != L'\\') {
            if (wVar5 == L'^') {
LAB_001111fc:
              *(undefined4 *)&gw_00[2].draw = 0;
              goto LAB_00110f4a;
            }
            if (wVar5 == L'|') {
LAB_0011120c:
              if (*(int *)&gw_00[1].prev - *(int *)&gw_00[2].win < 1) {
                local_17c = 0;
              }
              else {
                local_17c = *(int *)&gw_00[1].prev - *(int *)&gw_00[2].win;
              }
              *(int *)&gw_00[2].draw = local_17c;
              goto LAB_00110f4a;
            }
            if (wVar5 == L'~') {
              if (*(int *)((long)&gw_00[1].prev + 4) == 2) {
                idx = *(wchar_t *)&gw_00[2].draw;
                while( true ) {
                  bVar2 = false;
                  if (idx < icount) {
                    bVar2 = idx < *(int *)&gw_00[2].draw + *(int *)&gw_00[2].win;
                  }
                  if (!bVar2) break;
                  if (*(int *)(gw_00[1].resize + (long)idx * 0x124 + 0x110) != -1) {
                    wVar5 = L'\xffffffff';
                    if (((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17] != L'\0') {
                      wVar5 = L'\0';
                    }
                    ((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17] = wVar5;
                  }
                  idx = idx + L'\x01';
                }
              }
              goto LAB_00110f4a;
            }
            if (wVar5 != L'\x7f') {
              if (wVar5 == L'Ă') {
                if (*(int *)&gw_00[2].draw < *(int *)&gw_00[1].prev - *(int *)&gw_00[2].win) {
                  *(int *)&gw_00[2].draw = *(int *)&gw_00[2].draw + 1;
                }
                goto LAB_00110f4a;
              }
              if (wVar5 == L'ă') {
                if (0 < *(int *)&gw_00[2].draw) {
                  *(int *)&gw_00[2].draw = *(int *)&gw_00[2].draw + -1;
                }
                goto LAB_00110f4a;
              }
              if (wVar5 == L'Ć') goto LAB_001111fc;
              if (wVar5 != L'ć') {
                if (wVar5 == L'Œ') goto LAB_00111198;
                if (wVar5 == L'œ') goto LAB_0011116b;
                if (wVar5 == L'ŗ') goto LAB_0011125a;
                if (wVar5 == L'Ũ') goto LAB_0011120c;
                if ((wVar5 < L'0') || (L'9' < wVar5)) {
                  wVar6 = find_objaccel(wVar5,mdat_00);
                  if (wVar6 == L'\xffffffff') {
                    if (*(int *)((long)&gw_00[1].prev + 4) == 2) {
                      local_170 = 0;
                      for (idx = L'\0'; idx < *(wchar_t *)&gw_00[1].prev; idx = idx + L'\x01') {
                        if ((items[idx].group_accel == wVar5) &&
                           (*(int *)(gw_00[1].resize + (long)idx * 0x124 + 0x110) != -1)) {
                          if (*(int *)((long)&gw_00[2].draw + 4) < 1) {
                            wVar6 = L'\xffffffff';
                            if (((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17] != L'\0') {
                              wVar6 = L'\0';
                            }
                            ((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17] = wVar6;
                          }
                          else {
                            ((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17] =
                                 *(wchar_t *)((long)&gw_00[2].draw + 4);
                          }
                          if (*(wchar_t *)(gw_00[1].resize + (long)idx * 0x124 + 0x108) <=
                              ((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17]) {
                            ((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17] = L'\xffffffff';
                          }
                          local_170 = local_170 + 1;
                        }
                      }
                      if (local_170 != 0) {
                        *(undefined4 *)((long)&gw_00[2].draw + 4) = 0xffffffff;
                      }
                    }
                  }
                  else {
                    if (*(int *)((long)&gw_00[2].draw + 4) < 1) {
                      wVar5 = L'\xffffffff';
                      if (((gw_00[1].win)->_bkgrnd).chars[(long)wVar6 + -0x17] != L'\0') {
                        wVar5 = L'\0';
                      }
                      ((gw_00[1].win)->_bkgrnd).chars[(long)wVar6 + -0x17] = wVar5;
                    }
                    else {
                      ((gw_00[1].win)->_bkgrnd).chars[(long)wVar6 + -0x17] =
                           *(wchar_t *)((long)&gw_00[2].draw + 4);
                    }
                    if (*(wchar_t *)(gw_00[1].resize + (long)wVar6 * 0x124 + 0x108) <=
                        ((gw_00[1].win)->_bkgrnd).chars[(long)wVar6 + -0x17]) {
                      ((gw_00[1].win)->_bkgrnd).chars[(long)wVar6 + -0x17] = L'\xffffffff';
                    }
                    *(undefined4 *)((long)&gw_00[2].draw + 4) = 0xffffffff;
                    if (*(int *)((long)&gw_00[1].prev + 4) == 1) {
                      sbuf[0xff] = '\x01';
                    }
                    else if ((*(int *)((long)&gw_00[1].prev + 4) == -1) &&
                            (nVar3 = do_item_actions((nh_objitem *)
                                                     (gw_00[1].resize + (long)wVar6 * 0x124)),
                            nVar3 != '\0')) {
                      sbuf[0xff] = '\x01';
                    }
                  }
                }
                else {
                  if (*(int *)((long)&gw_00[2].draw + 4) == -1) {
                    *(undefined4 *)((long)&gw_00[2].draw + 4) = 0;
                  }
                  *(wchar_t *)((long)&gw_00[2].draw + 4) =
                       *(int *)((long)&gw_00[2].draw + 4) * 10 + wVar5 + L'\xffffffd0';
                  if (0xffff < *(int *)((long)&gw_00[2].draw + 4)) {
                    *(int *)((long)&gw_00[2].draw + 4) = *(int *)((long)&gw_00[2].draw + 4) / 10;
                  }
                }
                goto LAB_00110f4a;
              }
            }
            *(int *)((long)&gw_00[2].draw + 4) = *(int *)((long)&gw_00[2].draw + 4) / 10;
            if (*(int *)((long)&gw_00[2].draw + 4) == 0) {
              *(undefined4 *)((long)&gw_00[2].draw + 4) = 0xffffffff;
            }
            goto LAB_00110f4a;
          }
          idx = *(wchar_t *)&gw_00[2].draw;
          while( true ) {
            bVar2 = false;
            if (idx < icount) {
              bVar2 = idx < *(int *)&gw_00[2].draw + *(int *)&gw_00[2].win;
            }
            if (!bVar2) break;
            if (*(int *)(gw_00[1].resize + (long)idx * 0x124 + 0x110) != -1) {
              ((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17] = L'\0';
            }
            idx = idx + L'\x01';
          }
        }
      }
      goto LAB_00110f4a;
    }
    if (*(int *)((long)&gw_00[1].prev + 4) == 2) {
      idx = *(wchar_t *)&gw_00[2].draw;
      while( true ) {
        bVar2 = false;
        if (idx < icount) {
          bVar2 = idx < *(int *)&gw_00[2].draw + *(int *)&gw_00[2].win;
        }
        if (!bVar2) break;
        if (*(int *)(gw_00[1].resize + (long)idx * 0x124 + 0x110) != -1) {
          ((gw_00[1].win)->_bkgrnd).chars[(long)idx + -0x17] = L'\xffffffff';
        }
        idx = idx + L'\x01';
      }
    }
  } while( true );
}

Assistant:

int curses_display_objects(struct nh_objitem *items, int icount,
		  const char *title, int how, struct nh_objresult *results)
{
    struct gamewin *gw;
    struct win_objmenu *mdat;
    int i, key, idx, rv, startx, starty, prevcurs, prev_offset;
    nh_bool done, cancelled;
    char sbuf[BUFSZ];
    
    prevcurs = curs_set(0);
    
    gw = alloc_gamewin(sizeof(struct win_objmenu));
    gw->draw = draw_objmenu;
    gw->resize = resize_objmenu;
    mdat = (struct win_objmenu*)gw->extra;
    mdat->items = items;
    mdat->icount = icount;
    mdat->title = title;
    mdat->how = how;
    mdat->selcount = -1;
    mdat->selected = calloc(icount, sizeof(int));
    
    if (how != PICK_NONE && how != PICK_INVACTION)
	assign_objmenu_accelerators(mdat);
    layout_objmenu(gw);
    
    starty = (LINES - mdat->height) / 2;
    startx = (COLS - mdat->width) / 2;
    
    gw->win = newwin(mdat->height, mdat->width, starty, startx);
    keypad(gw->win, TRUE);
    nh_box_wborder(gw->win, FRAME_ATTRS);
    mdat->content = derwin(gw->win, mdat->innerheight, mdat->innerwidth,
			   mdat->frameheight-1, 2);
    leaveok(gw->win, TRUE);
    leaveok(mdat->content, TRUE);
    
    done = FALSE;
    cancelled = FALSE;
    while (!done && !cancelled) {
	draw_objmenu(gw);
	
	key = nh_wgetch(gw->win);
	
	switch (key) {
	    /* one line up */
	    case KEY_UP:
		if (mdat->offset > 0)
		    mdat->offset--;
		break;
		
	    /* one line down */
	    case KEY_DOWN:
		if (mdat->offset < mdat->icount - mdat->innerheight)
		    mdat->offset++;
		break;
	    
	    /* page up */
	    case KEY_PPAGE:
	    case '<':
		mdat->offset -= mdat->innerheight;
		if (mdat->offset < 0)
		    mdat->offset = 0;
		break;
	    
	    /* page down */
	    case KEY_NPAGE:
	    case '>':
	    case ' ':
		prev_offset = mdat->offset;
		mdat->offset += mdat->innerheight;
		if (mdat->offset > mdat->icount - mdat->innerheight)
		    mdat->offset = mdat->icount - mdat->innerheight;
		if (key == ' ' && prev_offset == mdat->offset)
		    done = TRUE;
		break;
		
	    /* go to the top */
	    case KEY_HOME:
	    case '^':
		mdat->offset = 0;
		break;
		
	    /* go to the end */
	    case KEY_END:
	    case '|':
		mdat->offset = max(mdat->icount - mdat->innerheight, 0);
		break;
		
	    /* cancel */
	    case KEY_ESC:
		cancelled = TRUE;
		break;
		
	    /* confirm */
	    case KEY_ENTER:
	    case '\r':
		done = TRUE;
		break;
		
	    /* select all */
	    case '.':
		if (mdat->how == PICK_ANY)
		    for (i = 0; i < icount; i++)
			if (mdat->items[i].oclass != -1)
			    mdat->selected[i] = -1;
		break;
		
	    /* select none */
	    case '-':
		for (i = 0; i < icount; i++)
		    mdat->selected[i] = 0;
		break;
		
	    /* invert all */
	    case '@':
		if (mdat->how == PICK_ANY)
		    for (i = 0; i < icount; i++)
			if (mdat->items[i].oclass != -1)
			    mdat->selected[i] = mdat->selected[i] ? 0 : -1;
		break;
		
	    /* select page */
	    case ',':
		if (mdat->how != PICK_ANY)
		    break;
		
		for (i = mdat->offset;
		     i < icount && i < mdat->offset + mdat->innerheight; i++)
		    if (mdat->items[i].oclass != -1)
			mdat->selected[i] = -1;
		break;
		
	    /* deselect page */
	    case '\\':
		for (i = mdat->offset;
		     i < icount && i < mdat->offset + mdat->innerheight; i++)
		    if (mdat->items[i].oclass != -1)
			mdat->selected[i] = 0;
		break;
		
	    /* invert page */
	    case '~':
		if (mdat->how != PICK_ANY)
		    break;
		
		for (i = mdat->offset;
		     i < icount && i < mdat->offset + mdat->innerheight; i++)
		    if (mdat->items[i].oclass != -1)
			mdat->selected[i] = mdat->selected[i] ? 0 : -1;
		break;
		
	    /* search for a menu item */
	    case ':':
		curses_getline("Search:", sbuf);
		for (i = 0; i < icount; i++)
		    if (strstr(mdat->items[i].caption, sbuf))
			break;
		if (i < icount) {
		    int end = max(mdat->icount - mdat->innerheight, 0);
		    mdat->offset = min(i, end);
		}
		break;
		
	    /* edit selection count */
	    case KEY_BACKSPACE:
	    case KEY_BACKDEL:
		mdat->selcount /= 10;
		if (mdat->selcount == 0)
		    mdat->selcount = -1; /* -1: select all */
		break;
		
	    default:
		/* selection allows an item count */
		if (key >= '0' && key <= '9') {
		    if (mdat->selcount == -1)
			mdat->selcount = 0;
		    mdat->selcount = mdat->selcount * 10 + (key - '0');
		    if (mdat->selcount > 0xffff)
			mdat->selcount /= 10;
		    
		    break;
		}
		
		/* try to find an item for this key and, if one is found, select it */
		idx = find_objaccel(key, mdat);
		
		if (idx != -1) { /* valid item accelerator */
		    if (mdat->selcount > 0)
			mdat->selected[idx] = mdat->selcount;
		    else
			mdat->selected[idx] = mdat->selected[idx] ? 0 : -1;
		    if (mdat->selected[idx] >= mdat->items[idx].count)
			mdat->selected[idx] = -1;
		    mdat->selcount = -1;
		    
		    if (mdat->how == PICK_ONE)
			done = TRUE;
		    
		    /* show item actions menu */
		    else if (mdat->how == PICK_INVACTION)
			if (do_item_actions(&mdat->items[idx]))
			    done = TRUE;
		    
		} else if (mdat->how == PICK_ANY) { /* maybe it's a group accel? */
		    int grouphits = 0;
		    for (i = 0; i < mdat->icount; i++) {
			if (items[i].group_accel == key && mdat->items[i].oclass != -1) {
			    if (mdat->selcount > 0)
				mdat->selected[i] = mdat->selcount;
			    else
				mdat->selected[i] = mdat->selected[i] ? 0 : -1;
			    if (mdat->selected[i] >= mdat->items[i].count)
				mdat->selected[i] = -1;
			    grouphits++;
			}
		    }
		    
		    if (grouphits)
			mdat->selcount = -1;
		}
		break;
	}
    }
    
    delwin(mdat->content);
    delwin(gw->win);
    
    if (cancelled)
	rv = -1;
    else {
	rv = 0;
	for (i = 0; i < icount; i++) {
	    if (mdat->selected[i]) {
		if (results) {
		    results[rv].id = items[i].id;
		    results[rv].count = mdat->selected[i];
		}
		rv++;
	    }
	}
    }
    
    free(mdat->selected);
    delete_gamewin(gw);
    redraw_game_windows();
    curs_set(prevcurs);
	
    return rv;
}